

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O3

int Cec_ManVerifyTwoAigs(Aig_Man_t *pAig0,Aig_Man_t *pAig1,int fVerbose)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  
  pGVar2 = Gia_ManFromAig(pAig0);
  p0 = Gia_ManCleanup(pGVar2);
  Gia_ManStop(pGVar2);
  pGVar2 = Gia_ManFromAig(pAig1);
  p1 = Gia_ManCleanup(pGVar2);
  Gia_ManStop(pGVar2);
  iVar1 = Cec_ManVerifyTwo(p0,p1,fVerbose);
  pAig0->pSeqModel = p0->pCexComb;
  p0->pCexComb = (Abc_Cex_t *)0x0;
  Gia_ManStop(p0);
  Gia_ManStop(p1);
  return iVar1;
}

Assistant:

int Cec_ManVerifyTwoAigs( Aig_Man_t * pAig0, Aig_Man_t * pAig1, int fVerbose )
{
    Gia_Man_t * p0, * p1, * pTemp;
    int RetValue;

    p0 = Gia_ManFromAig( pAig0 );
    p0 = Gia_ManCleanup( pTemp = p0 );
    Gia_ManStop( pTemp );

    p1 = Gia_ManFromAig( pAig1 );
    p1 = Gia_ManCleanup( pTemp = p1 );
    Gia_ManStop( pTemp );

    RetValue = Cec_ManVerifyTwo( p0, p1, fVerbose );
    pAig0->pSeqModel = p0->pCexComb; p0->pCexComb = NULL;
    Gia_ManStop( p0 );
    Gia_ManStop( p1 );
    return RetValue;
}